

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall ktx::ValidationContext::validateSGD(ValidationContext *this)

{
  uint *args_5;
  uint *args_4;
  uint32_t uVar1;
  ktx_uint64_t kVar2;
  pointer pkVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  uint uVar7;
  void *__s;
  int iVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  bool bVar12;
  uint32_t imageIndex;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  long lVar20;
  undefined1 in_XMM9 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  uint uVar24;
  undefined1 auVar23 [16];
  uint uVar25;
  int iVar26;
  undefined1 in_XMM12 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  uint32_t imageCount;
  ktx_uint64_t sgdByteLength;
  uint64_t expectedBgdByteLength;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  void *local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  kVar2 = (this->header).supercompressionGlobalData.byteOffset;
  uVar13 = (this->header).supercompressionGlobalData.byteLength;
  if (uVar13 != 0 && kVar2 != 0) {
    local_48 = uVar13;
    __s = operator_new__(uVar13);
    memset(__s,0,uVar13);
    local_50 = __s;
    (*this->_vptr_ValidationContext[2])(this,kVar2,__s,uVar13,7,"the SGD");
    if ((this->header).supercompressionScheme == 1) {
      local_58 = 0;
      uVar1 = this->numLevels;
      if (uVar1 != 0) {
        uVar10 = (this->header).pixelDepth;
        uVar9 = (this->header).faceCount * this->numLayers;
        uVar7 = uVar1 + 3 & 0xfffffffc;
        iVar8 = uVar1 - 1;
        auVar14._4_4_ = iVar8;
        auVar14._0_4_ = iVar8;
        auVar14._8_4_ = iVar8;
        auVar14._12_4_ = iVar8;
        auVar18._4_4_ = uVar10;
        auVar18._0_4_ = uVar10;
        auVar18._8_4_ = uVar10;
        auVar18._12_4_ = uVar10;
        auVar21 = ZEXT416(0);
        auVar19 = _DAT_001fd350;
        do {
          auVar15 = auVar19;
          auVar17 = auVar21;
          auVar21 = pshuflw(in_XMM9,auVar15,0xfe);
          uVar24 = uVar10 >> auVar21._0_8_;
          auVar21 = pshuflw(auVar21,auVar15,0x54);
          uVar25 = uVar10 >> auVar21._0_8_;
          auVar22._0_8_ = auVar15._8_8_;
          auVar22._8_4_ = auVar15._8_4_;
          auVar22._12_4_ = auVar15._12_4_;
          auVar21 = pshuflw(in_XMM12,auVar22,0xfe);
          lVar20 = auVar21._0_8_;
          auVar5._4_8_ = auVar18._8_8_;
          auVar5._0_4_ = uVar10 >> lVar20;
          auVar28._0_8_ = auVar5._0_8_ << 0x20;
          auVar28._8_4_ = uVar10 >> lVar20;
          auVar28._12_4_ = uVar10 >> lVar20;
          auVar21 = pshuflw(auVar22,auVar22,0x54);
          lVar20 = auVar21._0_8_;
          auVar6._4_8_ = auVar18._8_8_;
          auVar6._0_4_ = uVar10 >> lVar20;
          auVar27._0_8_ = auVar6._0_8_ << 0x20;
          auVar27._8_4_ = uVar10 >> lVar20;
          auVar27._12_4_ = uVar10 >> lVar20;
          in_XMM12._8_8_ = auVar28._8_8_;
          in_XMM12._0_8_ = auVar27._8_8_;
          iVar8 = uVar24 + (uVar24 == 0);
          iVar26 = auVar28._12_4_ + (auVar28._12_4_ == 0);
          auVar4._4_4_ = uVar9;
          auVar4._0_4_ = uVar9;
          auVar4._8_4_ = uVar9;
          auVar4._12_4_ = uVar9;
          auVar23._4_4_ = iVar8;
          auVar23._0_4_ = iVar8;
          auVar23._8_4_ = iVar26;
          auVar23._12_4_ = iVar26;
          auVar21._0_4_ = uVar9 * (uVar25 + (uVar25 == 0)) + auVar17._0_4_;
          auVar21._4_4_ = iVar8 * uVar9 + auVar17._4_4_;
          auVar21._8_4_ =
               (int)((auVar4._8_8_ & 0xffffffff) * (ulong)(auVar27._8_4_ + (auVar27._8_4_ == 0))) +
               auVar17._8_4_;
          auVar21._12_4_ = (int)((auVar23._8_8_ & 0xffffffff) * (ulong)uVar9) + auVar17._12_4_;
          auVar19._0_4_ = auVar15._0_4_ + 4;
          auVar19._4_4_ = auVar15._4_4_ + 4;
          auVar19._8_4_ = auVar15._8_4_ + 4;
          auVar19._12_4_ = auVar15._12_4_ + 4;
          uVar7 = uVar7 - 4;
          in_XMM9 = auVar17;
        } while (uVar7 != 0);
        auVar14 = auVar14 ^ _DAT_001fd370;
        auVar15 = auVar15 ^ _DAT_001fd370;
        auVar16._0_4_ = -(uint)(auVar14._0_4_ < auVar15._0_4_);
        auVar16._4_4_ = -(uint)(auVar14._4_4_ < auVar15._4_4_);
        auVar16._8_4_ = -(uint)(auVar14._8_4_ < auVar15._8_4_);
        auVar16._12_4_ = -(uint)(auVar14._12_4_ < auVar15._12_4_);
        auVar21 = ~auVar16 & auVar21 | auVar17 & auVar16;
        local_58 = auVar21._12_4_ + auVar21._4_4_ + auVar21._8_4_ + auVar21._0_4_;
      }
      if (local_48 < 0x14) {
        error<unsigned_long_const&>(this,&SGD::BLZESizeTooSmallHeader,&local_48);
      }
      else {
        local_38 = (ulong)*(uint *)((long)local_50 + 8) + (ulong)*(uint *)((long)local_50 + 0x10) +
                   (ulong)*(uint *)((long)local_50 + 4) + (ulong)*(uint *)((long)local_50 + 0xc) +
                   (ulong)local_58 * 0x14 + 0x14;
        if (local_48 != local_38) {
          error<unsigned_long_const&,unsigned_int&,unsigned_long_const&>
                    (this,&SGD::BLZESizeIncorrect,&local_48,&local_58,&local_38);
        }
        if ((((this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
              super__Optional_payload_base<_khr_df_model_e>._M_engaged == true) &&
            ((this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
             super__Optional_payload_base<_khr_df_model_e>._M_payload._M_value == KHR_DF_MODEL_ETC1S
            )) && (*(uint *)((long)local_50 + 0x10) != 0)) {
          error<unsigned_int_const&>
                    (this,&SGD::BLZEExtendedByteLengthNotZero,(uint *)((long)local_50 + 0x10));
        }
        if (((ulong)local_58 * 0x14 + 0x14 <= local_48) && (local_64 = 0, this->numLevels != 0)) {
          local_40 = (long)local_50 + 0x14;
          uVar13 = 0;
          bVar11 = false;
          bVar12 = false;
          do {
            local_5c = 0;
            if (this->numLayers != 0) {
              do {
                local_60 = 0;
                if ((this->header).faceCount != 0) {
                  do {
                    local_54 = 0;
                    bVar12 = bVar11;
                    do {
                      args_4 = (uint *)(local_40 + uVar13 * 0x14);
                      if ((*args_4 & 2) != 0) {
                        bVar12 = true;
                      }
                      if ((*args_4 & 0xfffffffd) != 0) {
                        error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                                  (this,&SGD::BLZEInvalidImageFlagBit,&local_64,&local_5c,&local_60,
                                   &local_54,args_4);
                      }
                      if (args_4[2] == 0) {
                        error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                                  (this,&SGD::BLZEZeroRGBLength,&local_64,&local_5c,&local_60,
                                   &local_54,args_4 + 2);
                      }
                      pkVar3 = (this->levelIndices).
                               super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      if (pkVar3[local_64].byteLength < (ulong)(args_4[2] + args_4[1])) {
                        error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&,unsigned_int_const&,unsigned_long&>
                                  (this,&SGD::BLZEInvalidRGBSlice,&local_64,&local_5c,&local_60,
                                   &local_54,args_4 + 1,args_4 + 2,&pkVar3[local_64].byteLength);
                      }
                      args_5 = args_4 + 4;
                      pkVar3 = (this->levelIndices).
                               super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      if (pkVar3[local_64].byteLength < (ulong)(args_4[4] + args_4[3])) {
                        error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&,unsigned_int_const&,unsigned_long&>
                                  (this,&SGD::BLZEInvalidAlphaSlice,&local_64,&local_5c,&local_60,
                                   &local_54,args_4 + 3,args_5,&pkVar3[local_64].byteLength);
                      }
                      if ((*args_5 == 0) && (this->numSamples == 2)) {
                        error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&>
                                  (this,&SGD::BLZEDFDMismatchAlpha,&local_64,&local_5c,&local_60,
                                   &local_54);
                      }
                      if ((*args_5 != 0) && (this->numSamples == 1)) {
                        error<unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int&,unsigned_int_const&>
                                  (this,&SGD::BLZEDFDMismatchNoAlpha,&local_64,&local_5c,&local_60,
                                   &local_54,args_5);
                      }
                      local_54 = local_54 + 1;
                      uVar10 = (this->header).pixelDepth >> ((byte)local_64 & 0x1f);
                      uVar13 = (ulong)((int)uVar13 + 1);
                    } while (local_54 < uVar10 + (uVar10 == 0));
                    local_60 = local_60 + 1;
                    bVar11 = bVar12;
                  } while (local_60 < (this->header).faceCount);
                }
                local_5c = local_5c + 1;
              } while (local_5c < this->numLayers);
            }
            local_64 = local_64 + 1;
          } while (local_64 < this->numLevels);
          if ((bVar12) && (this->foundKTXanimData == false)) {
            error<>(this,&SGD::BLZENoAnimationSequencesPFrame);
          }
        }
      }
    }
    operator_delete__(local_50);
  }
  return;
}

Assistant:

void ValidationContext::validateSGD() {
    const auto sgdByteOffset = header.supercompressionGlobalData.byteOffset;
    const auto sgdByteLength = header.supercompressionGlobalData.byteLength;

    if (sgdByteOffset == 0 || sgdByteLength == 0)
        return; // There is no SGD block

    const auto buffer = std::make_unique<uint8_t[]>(sgdByteLength);
    read(sgdByteOffset, buffer.get(), sgdByteLength, "the SGD");

    if (header.supercompressionScheme != KTX_SS_BASIS_LZ)
        return;

    // Validate BASIS_LZ SGD

    uint32_t imageCount = 0;
    // uint32_t layersFaces = numLayers * header.faceCount;
    for (uint32_t level = 0; level < numLevels; ++level)
        // numFaces * depth is only reasonable because they can't both be > 1. There are no 3D cubemaps
        imageCount += numLayers * header.faceCount * std::max(header.pixelDepth >> level, 1u);

    // Validate GlobalHeader
    if (sgdByteLength < sizeof(ktxBasisLzGlobalHeader)) {
        error(SGD::BLZESizeTooSmallHeader, sgdByteLength);
        return;
    }

    const ktxBasisLzGlobalHeader& bgh = *reinterpret_cast<const ktxBasisLzGlobalHeader*>(buffer.get());

    const uint64_t expectedBgdByteLength =
            sizeof(ktxBasisLzGlobalHeader) +
            sizeof(ktxBasisLzEtc1sImageDesc) * imageCount +
            bgh.endpointsByteLength +
            bgh.selectorsByteLength +
            bgh.tablesByteLength +
            bgh.extendedByteLength;
    if (sgdByteLength != expectedBgdByteLength)
        error(SGD::BLZESizeIncorrect, sgdByteLength, imageCount, expectedBgdByteLength);

    if (parsedColorModel && *parsedColorModel == KHR_DF_MODEL_ETC1S && bgh.extendedByteLength != 0)
        error(SGD::BLZEExtendedByteLengthNotZero, bgh.extendedByteLength);

    // Validate ImageDesc
    if (sgdByteLength < sizeof(ktxBasisLzGlobalHeader) + sizeof(ktxBasisLzEtc1sImageDesc) * imageCount)
        return;

    const ktxBasisLzEtc1sImageDesc* imageDescs = BGD_ETC1S_IMAGE_DESCS(buffer.get());

    bool foundPFrame = false;
    uint32_t i = 0;
    for (uint32_t level = 0; level < numLevels; ++level) {
        for (uint32_t layer = 0; layer < numLayers; ++layer) {
            for (uint32_t face = 0; face < header.faceCount; ++face) {
                for (uint32_t zSlice = 0; zSlice < std::max(header.pixelDepth >> level, 1u); ++zSlice) {
                    const auto imageIndex = i++;
                    const auto& image = imageDescs[imageIndex];

                    if (image.imageFlags & ETC1S_P_FRAME)
                        foundPFrame = true;

                    if (image.imageFlags & ~ETC1S_P_FRAME)
                        error(SGD::BLZEInvalidImageFlagBit, level, layer, face, zSlice, image.imageFlags);

                    if (image.rgbSliceByteLength == 0)
                        error(SGD::BLZEZeroRGBLength, level, layer, face, zSlice, image.rgbSliceByteLength);

                    if (image.rgbSliceByteOffset + image.rgbSliceByteLength > levelIndices[level].byteLength)
                        error(SGD::BLZEInvalidRGBSlice, level, layer, face, zSlice, image.rgbSliceByteOffset, image.rgbSliceByteLength, levelIndices[level].byteLength);
                    if (image.alphaSliceByteOffset + image.alphaSliceByteLength > levelIndices[level].byteLength)
                        error(SGD::BLZEInvalidAlphaSlice, level, layer, face, zSlice, image.alphaSliceByteOffset, image.alphaSliceByteLength, levelIndices[level].byteLength);

                    // Crosscheck with the DFD numSamples
                    if (image.alphaSliceByteLength == 0 && numSamples == 2)
                        error(SGD::BLZEDFDMismatchAlpha, level, layer, face, zSlice);
                    if (image.alphaSliceByteLength != 0 && numSamples == 1)
                        error(SGD::BLZEDFDMismatchNoAlpha, level, layer, face, zSlice, image.alphaSliceByteLength);
                }
            }
        }
    }

    if (foundPFrame)
        if (!foundKTXanimData)
            error(SGD::BLZENoAnimationSequencesPFrame);
}